

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void __thiscall GEO::Process::SpinLockArray::acquire_spinlock(SpinLockArray *this,index_t i)

{
  char cVar1;
  reference ptr;
  index_t b;
  index_t w;
  index_t i_local;
  SpinLockArray *this_local;
  
  while( true ) {
    ptr = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (&this->spinlocks_,(ulong)(i >> 5));
    cVar1 = atomic_bittestandset_x86(ptr,i & 0x1f);
    if (cVar1 == '\0') break;
    geo_pause();
  }
  return;
}

Assistant:

void acquire_spinlock(index_t i) {
                geo_thread_sync_assert(i < size());
                index_t w = i >> 5;
                index_t b = i & 31;
                while(atomic_bittestandset_x86(&spinlocks_[w], Numeric::uint32(b))) {
                    // Intel recommends to have a PAUSE asm instruction
                    // in the spinlock loop. It is generated using the
                    // following intrinsic function of GCC.
                    geo_pause();
                }
            }